

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

void helper_sve_fcadd_d_aarch64(void *vd,void *vn,void *vm,void *vg,void *vs,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  float64 fVar3;
  float64 fVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = (ulong)((desc & 0x1f) * 8 + 8);
  uVar6 = (ulong)(desc >> 10) << 0x3f;
  do {
    uVar1 = *(ulong *)((long)vg + ((long)(uVar5 - 1) >> 6) * 8);
    uVar7 = uVar5;
    do {
      uVar5 = uVar7 - 0x10;
      fVar4 = *(float64 *)((long)vn + (uVar7 - 8));
      uVar2 = *(ulong *)((long)vm + (uVar7 - 0x10));
      if ((uVar1 >> ((uint)uVar5 & 0x3f) & 1) != 0) {
        fVar3 = float64_add_aarch64(*(float64 *)((long)vn + (uVar7 - 0x10)),
                                    *(ulong *)((long)vm + (uVar7 - 8)) ^ uVar6 ^ 0x8000000000000000,
                                    (float_status *)vs);
        *(float64 *)((long)vd + (uVar7 - 0x10)) = fVar3;
      }
      if ((uVar1 >> (uVar7 - 8 & 0x3f) & 1) != 0) {
        fVar4 = float64_add_aarch64(fVar4,uVar2 ^ uVar6,(float_status *)vs);
        *(float64 *)((long)vd + (uVar7 - 8)) = fVar4;
      }
      uVar7 = uVar5;
    } while ((uVar5 & 0x3f) != 0);
  } while (uVar5 != 0);
  return;
}

Assistant:

void HELPER(sve_fcadd_d)(void *vd, void *vn, void *vm, void *vg,
                         void *vs, uint32_t desc)
{
    intptr_t j, i = simd_oprsz(desc);
    uint64_t *g = vg;
    float64 neg_imag = float64_set_sign(0, simd_data(desc));
    float64 neg_real = float64_chs(neg_imag);

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            float64 e0, e1, e2, e3;

            /* I holds the real index; J holds the imag index.  */
            j = i - sizeof(float64);
            i -= 2 * sizeof(float64);

            e0 = *(float64 *)((char *)vn + H1_2(i));
            e1 = *(float64 *)((char *)vm + H1_2(j)) ^ neg_real;
            e2 = *(float64 *)((char *)vn + H1_2(j));
            e3 = *(float64 *)((char *)vm + H1_2(i)) ^ neg_imag;

            if (likely((pg >> (i & 63)) & 1)) {
                *(float64 *)((char *)vd + H1_2(i)) = float64_add(e0, e1, vs);
            }
            if (likely((pg >> (j & 63)) & 1)) {
                *(float64 *)((char *)vd + H1_2(j)) = float64_add(e2, e3, vs);
            }
        } while (i & 63);
    } while (i != 0);
}